

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio.cc
# Opt level: O0

BIO * BIO_push(BIO *b,BIO *append)

{
  BIO *local_28;
  BIO *last_bio;
  BIO *appended_bio_local;
  BIO *bio_local;
  
  local_28 = b;
  if (b != (BIO *)0x0) {
    for (; local_28->ptr != (void *)0x0; local_28 = (BIO *)local_28->ptr) {
    }
    local_28->ptr = append;
  }
  return b;
}

Assistant:

BIO *BIO_push(BIO *bio, BIO *appended_bio) {
  BIO *last_bio;

  if (bio == NULL) {
    return bio;
  }

  last_bio = bio;
  while (last_bio->next_bio != NULL) {
    last_bio = last_bio->next_bio;
  }

  last_bio->next_bio = appended_bio;
  return bio;
}